

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O2

uint8_t monster_list_entry_line_color(monster_list_entry_t *entry)

{
  _Bool _Var1;
  uint8_t uVar2;
  
  _Var1 = flag_has_dbg(entry->race->flags,0xc,1,"entry->race->flags","RF_UNIQUE");
  uVar2 = '\x11';
  if (!_Var1) {
    uVar2 = ((int)player->depth < entry->race->level) * '\x03' + '\x01';
  }
  return uVar2;
}

Assistant:

uint8_t monster_list_entry_line_color(const monster_list_entry_t *entry)
{
	/* Display uniques in a special colour */
	if (rf_has(entry->race->flags, RF_UNIQUE))
		return COLOUR_VIOLET;
	else if (entry->race->level > player->depth)
		return COLOUR_RED;
	else
		return COLOUR_WHITE;
}